

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeCornerAngles
          (IntrinsicGeometryInterface *this)

{
  double dVar1;
  SurfaceMesh *pSVar2;
  size_t sVar3;
  pointer puVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  runtime_error *this_00;
  long *plVar8;
  double *pdVar9;
  size_type *psVar10;
  long *plVar11;
  ParentMeshT *pPVar12;
  ulong uVar13;
  size_t i;
  ulong uVar14;
  size_t i_1;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  undefined1 local_c8 [24];
  long lStack_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->edgeLengthsQ).super_DependentQuantity.computed == false) {
    if ((this->edgeLengthsQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc);
    (this->edgeLengthsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Corner,_double>::MeshData
            ((MeshData<geometrycentral::surface::Corner,_double> *)local_c8,
             (this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Corner,_double>::operator=
            (&this->cornerAngles,(MeshData<geometrycentral::surface::Corner,_double> *)local_c8);
  MeshData<geometrycentral::surface::Corner,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Corner,_double> *)local_c8);
  pSVar2 = (this->super_BaseGeometryInterface).mesh;
  sVar3 = pSVar2->nHalfedgesFillCount;
  if ((sVar3 == 0) ||
     ((puVar4 = (pSVar2->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start, *puVar4 != 0xffffffffffffffff &&
      (*(pSVar2->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start < pSVar2->nFacesFillCount)))) {
    uVar15 = 0;
  }
  else {
    uVar15 = 1;
    if (sVar3 != 1) {
      while ((puVar4[uVar15] == 0xffffffffffffffff ||
             (pSVar2->nFacesFillCount <=
              (pSVar2->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar15]))) {
        uVar15 = uVar15 + 1;
        if (sVar3 == uVar15) {
          return;
        }
      }
    }
  }
  if (uVar15 != sVar3) {
    while( true ) {
      puVar4 = (pSVar2->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = puVar4[uVar15];
      uVar7 = puVar4[uVar13];
      if (puVar4[uVar7] != uVar15) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]gc-polyscope-project-template/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
                   ,"");
        ::std::operator+(&local_70,"GC_SAFETY_ASSERT FAILURE from ",&local_108);
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_70);
        psVar10 = (size_type *)(plVar8 + 2);
        local_128._M_dataplus._M_p = (pointer)*plVar8;
        if ((size_type *)local_128._M_dataplus._M_p == psVar10) {
          local_128.field_2._M_allocated_capacity = *psVar10;
          local_128.field_2._8_8_ = plVar8[3];
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar10;
        }
        local_128._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        ::std::__cxx11::to_string(&local_90,0x75);
        ::std::operator+(&local_50,&local_128,&local_90);
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_50);
        plVar11 = plVar8 + 2;
        local_e8 = (long *)*plVar8;
        if (local_e8 == plVar11) {
          local_d8 = *plVar11;
          lStack_d0 = plVar8[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar11;
        }
        local_e0 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_e8);
        pPVar12 = (ParentMeshT *)(plVar8 + 2);
        local_c8._0_8_ = *plVar8;
        if ((ParentMeshT *)local_c8._0_8_ == pPVar12) {
          local_c8._16_8_ = pPVar12->_vptr_SurfaceMesh;
          lStack_b0 = plVar8[3];
          local_c8._0_8_ = (ParentMeshT *)(local_c8 + 0x10);
        }
        else {
          local_c8._16_8_ = pPVar12->_vptr_SurfaceMesh;
        }
        local_c8._8_8_ = plVar8[1];
        *plVar8 = (long)pPVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        ::std::runtime_error::runtime_error(this_00,(string *)local_c8);
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (pSVar2->useImplicitTwinFlag == true) {
        pdVar9 = (this->edgeLengths).data.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar13 = uVar13 >> 1;
        uVar14 = uVar15 >> 1;
        uVar7 = uVar7 >> 1;
      }
      else {
        puVar4 = (pSVar2->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (this->edgeLengths).data.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar13 = puVar4[uVar13];
        uVar14 = puVar4[uVar15];
        uVar7 = puVar4[uVar7];
      }
      dVar16 = pdVar9[uVar7];
      dVar1 = pdVar9[uVar14];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar1;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = pdVar9[uVar13];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar16 * dVar16;
      auVar18 = vfmadd231sd_fma(auVar20,auVar18,auVar18);
      auVar18 = vfnmadd231sd_fma(auVar18,auVar17,auVar17);
      auVar19._0_8_ = auVar18._0_8_ / ((dVar1 + dVar1) * dVar16);
      auVar19._8_8_ = auVar18._8_8_;
      uVar5 = vcmpsd_avx512f(ZEXT816(0x3ff0000000000000),auVar19,1);
      bVar6 = (bool)((byte)uVar5 & 1);
      auVar18 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar19);
      dVar16 = acos((double)((ulong)bVar6 * 0x3ff0000000000000 + (ulong)!bVar6 * auVar18._0_8_));
      (this->cornerAngles).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data[uVar15] = dVar16;
      uVar15 = uVar15 + 1;
      if (uVar15 == sVar3) break;
      while (((pSVar2->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar15] == 0xffffffffffffffff ||
             (pSVar2->nFacesFillCount <=
              (pSVar2->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar15]))) {
        uVar15 = uVar15 + 1;
        if (sVar3 == uVar15) {
          return;
        }
      }
      if (sVar3 == uVar15) {
        return;
      }
    }
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeCornerAngles() {
  edgeLengthsQ.ensureHave();

  cornerAngles = CornerData<double>(mesh);

  for (Corner c : mesh.corners()) {
    // WARNING: Logic duplicated between cached and immediate version
    Halfedge heA = c.halfedge();
    Halfedge heOpp = heA.next();
    Halfedge heB = heOpp.next();

    GC_SAFETY_ASSERT(heB.next() == heA, "faces must be triangular");

    double lOpp = edgeLengths[heOpp.edge()];
    double lA = edgeLengths[heA.edge()];
    double lB = edgeLengths[heB.edge()];

    double q = (lA * lA + lB * lB - lOpp * lOpp) / (2. * lA * lB);
    q = clamp(q, -1.0, 1.0);
    double angle = std::acos(q);

    cornerAngles[c] = angle;
  }
}